

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O3

void __thiscall CircBufTest::thread2main(CircBufTest *this)

{
  CircularBuffer *pCVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char local_b8 [136];
  
  pcVar4 = local_b8;
  local_b8[0] = -1;
  local_b8[1] = -1;
  local_b8[2] = -1;
  local_b8[3] = -1;
  local_b8[4] = -1;
  local_b8[5] = -1;
  local_b8[6] = -1;
  local_b8[7] = -1;
  local_b8[8] = -1;
  local_b8[9] = -1;
  local_b8[10] = -1;
  local_b8[0xb] = -1;
  local_b8[0xc] = -1;
  local_b8[0xd] = -1;
  local_b8[0xe] = -1;
  local_b8[0xf] = -1;
  local_b8[0x10] = -1;
  local_b8[0x11] = -1;
  local_b8[0x12] = -1;
  local_b8[0x13] = -1;
  local_b8[0x14] = -1;
  local_b8[0x15] = -1;
  local_b8[0x16] = -1;
  local_b8[0x17] = -1;
  local_b8[0x18] = -1;
  local_b8[0x19] = -1;
  local_b8[0x1a] = -1;
  local_b8[0x1b] = -1;
  local_b8[0x1c] = -1;
  local_b8[0x1d] = -1;
  local_b8[0x1e] = -1;
  local_b8[0x1f] = -1;
  local_b8[0x20] = -1;
  local_b8[0x21] = -1;
  local_b8[0x22] = -1;
  local_b8[0x23] = -1;
  local_b8[0x24] = -1;
  local_b8[0x25] = -1;
  local_b8[0x26] = -1;
  local_b8[0x27] = -1;
  local_b8[0x28] = -1;
  local_b8[0x29] = -1;
  local_b8[0x2a] = -1;
  local_b8[0x2b] = -1;
  local_b8[0x2c] = -1;
  local_b8[0x2d] = -1;
  local_b8[0x2e] = -1;
  local_b8[0x2f] = -1;
  local_b8[0x30] = -1;
  local_b8[0x31] = -1;
  local_b8[0x32] = -1;
  local_b8[0x33] = -1;
  local_b8[0x34] = -1;
  local_b8[0x35] = -1;
  local_b8[0x36] = -1;
  local_b8[0x37] = -1;
  local_b8[0x38] = -1;
  local_b8[0x39] = -1;
  local_b8[0x3a] = -1;
  local_b8[0x3b] = -1;
  local_b8[0x3c] = -1;
  local_b8[0x3d] = -1;
  local_b8[0x3e] = -1;
  local_b8[0x3f] = -1;
  local_b8[0x40] = -1;
  local_b8[0x41] = -1;
  local_b8[0x42] = -1;
  local_b8[0x43] = -1;
  local_b8[0x44] = -1;
  local_b8[0x45] = -1;
  local_b8[0x46] = -1;
  local_b8[0x47] = -1;
  local_b8[0x48] = -1;
  local_b8[0x49] = -1;
  local_b8[0x4a] = -1;
  local_b8[0x4b] = -1;
  local_b8[0x4c] = -1;
  local_b8[0x4d] = -1;
  local_b8[0x4e] = -1;
  local_b8[0x4f] = -1;
  local_b8[0x50] = -1;
  local_b8[0x51] = -1;
  local_b8[0x52] = -1;
  local_b8[0x53] = -1;
  local_b8[0x54] = -1;
  local_b8[0x55] = -1;
  local_b8[0x56] = -1;
  local_b8[0x57] = -1;
  local_b8[0x58] = -1;
  local_b8[0x59] = -1;
  local_b8[0x5a] = -1;
  local_b8[0x5b] = -1;
  local_b8[0x5c] = -1;
  local_b8[0x5d] = -1;
  local_b8[0x5e] = -1;
  local_b8[0x5f] = -1;
  local_b8[0x60] = -1;
  local_b8[0x61] = -1;
  local_b8[0x62] = -1;
  local_b8[99] = -1;
  local_b8[100] = -1;
  local_b8[0x65] = -1;
  local_b8[0x66] = -1;
  local_b8[0x67] = -1;
  local_b8[0x68] = -1;
  local_b8[0x69] = -1;
  local_b8[0x6a] = -1;
  local_b8[0x6b] = -1;
  local_b8[0x6c] = -1;
  local_b8[0x6d] = -1;
  local_b8[0x6e] = -1;
  local_b8[0x6f] = -1;
  local_b8[0x70] = -1;
  local_b8[0x71] = -1;
  local_b8[0x72] = -1;
  local_b8[0x73] = -1;
  local_b8[0x74] = -1;
  local_b8[0x75] = -1;
  local_b8[0x76] = -1;
  local_b8[0x77] = -1;
  local_b8[0x78] = -1;
  local_b8[0x79] = -1;
  local_b8[0x7a] = -1;
  local_b8[0x7b] = -1;
  local_b8[0x7c] = -1;
  local_b8[0x7d] = -1;
  local_b8[0x7e] = -1;
  local_b8[0x7f] = -1;
  local_138 = 0xa0a0a0a0a0a0a0a;
  uStack_130 = 0xa0a0a0a0a0a0a0a;
  local_128 = 0xa0a0a0a0a0a0a0a;
  uStack_120 = 0xa0a0a0a0a0a0a0a;
  local_118 = 0xa0a0a0a0a0a0a0a;
  uStack_110 = 0xa0a0a0a0a0a0a0a;
  local_108 = 0xa0a0a0a0a0a0a0a;
  uStack_100 = 0xa0a0a0a0a0a0a0a;
  local_f8 = 0xa0a0a0a0a0a0a0a;
  uStack_f0 = 0xa0a0a0a0a0a0a0a;
  local_e8 = 0xa0a0a0a0a0a0a0a;
  uStack_e0 = 0xa0a0a0a0a0a0a0a;
  local_d8 = 0xa0a0a0a0a0a0a0a;
  uStack_d0 = 0xa0a0a0a0a0a0a0a;
  local_c8 = 0xa0a0a0a0a0a0a0a;
  uStack_c0 = 0xa0a0a0a0a0a0a0a;
  pCVar1 = &this->gbuff;
  Mutex::Lock();
  iVar2 = JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::write((uchar *)pCVar1,(int)pcVar4);
  JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::copy((uchar *)pCVar1,(int)&local_138);
  lVar3 = (long)iVar2 + -1;
  do {
    if (*pcVar4 != *(char *)((long)&local_138 + lVar3 + 1)) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                 ,0x350,"Lock doesn\'t work.");
    }
    lVar3 = lVar3 + 1;
    pcVar4 = pcVar4 + 1;
  } while (lVar3 < iVar2 + 0x3f);
  Mutex::Unlock();
  iVar2 = JetHead::CircularBuffer::waitForFreeSpace((int)pCVar1,0x80);
  if (iVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x357,"waitForFreeSpace might be broken.");
  }
  return;
}

Assistant:

void CircBufTest::thread2main()
{

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];

	fill(buf, buf + BUFFER_SIZE, -1);
	fill(dumpBuf, dumpBuf + BUFFER_SIZE, 10);

	gbuff.Lock();
	int offset = gbuff.getLength();

	gbuff.write(buf, BUFFER_SIZE / 2);

	gbuff.copy(dumpBuf, gbuff.getLength());

	for( int i = 0 + offset; i < offset + (BUFFER_SIZE / 2); ++i)
		if( buf[i - offset] != dumpBuf[i] )
			TestFailed("Lock doesn't work.");


	gbuff.Unlock();

	// Wait till the other guy clears the buffer.
	if(!gbuff.waitForFreeSpace(BUFFER_SIZE, 1000))
		TestFailed("waitForFreeSpace might be broken.");


}